

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_strutil.cpp
# Opt level: O0

int test_strutil_compmatch(ITesting *t)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  reference __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  undefined1 local_190 [7];
  bool isMatch;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> p;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  int flag;
  string tc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100 [32];
  string local_e0 [32];
  undefined1 local_c0 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cases;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58 [32];
  undefined1 local_38 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  patterns;
  ITesting *t_local;
  
  cases.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
  local_80 = &local_78;
  patterns.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)t;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"!func",&local_81);
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,"flurp",
             (allocator<char> *)
             ((long)&cases.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  cases.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
  local_38._0_8_ = &local_78;
  local_38._8_8_ = 2;
  this = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)((long)&cases.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this);
  __l_00._M_len = local_38._8_8_;
  __l_00._M_array = (iterator)local_38._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_38 + 0x10),__l_00,this);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&cases.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38;
  do {
    local_1c8 = local_1c8 + -1;
    std::__cxx11::string::~string((string *)local_1c8);
  } while (local_1c8 != &local_78);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&cases.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<char>::~allocator(&local_81);
  tc.field_2._M_local_buf[0xc] = '\x01';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"func",(allocator<char> *)(tc.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,"flurp",(allocator<char> *)(tc.field_2._M_local_buf + 0xe));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_e0,"apa",(allocator<char> *)(tc.field_2._M_local_buf + 0xd));
  tc.field_2._M_local_buf[0xc] = '\0';
  local_c0._0_8_ = &local_120;
  local_c0._8_8_ = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(tc.field_2._M_local_buf + 0xb));
  __l._M_len = local_c0._8_8_;
  __l._M_array = (iterator)local_c0._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_c0 + 0x10),__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(tc.field_2._M_local_buf + 0xb));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(tc.field_2._M_local_buf + 0xb));
  local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
  do {
    local_218 = local_218 + -1;
    std::__cxx11::string::~string((string *)local_218);
  } while (local_218 != &local_120);
  std::allocator<char>::~allocator((allocator<char> *)(tc.field_2._M_local_buf + 0xd));
  std::allocator<char>::~allocator((allocator<char> *)(tc.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator((allocator<char> *)(tc.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flag,"flurp",(allocator<char> *)((long)&__range1 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  __range1._0_4_ = 1;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_38 + 0x10));
  p.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_38 + 0x10));
  while (bVar1 = __gnu_cxx::
                 operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&p.field_2 + 8)), ((bVar1 ^ 0xffU) & 1) != 0) {
    __str = __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end1);
    std::__cxx11::string::string((string *)local_190,__str);
    bVar1 = trun::match((string *)&flag,(string *)local_190);
    __range1._0_4_ = bVar1 & (uint)__range1;
    std::__cxx11::string::~string((string *)local_190);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  printf("flag: %d\n",(ulong)(uint)__range1);
  std::__cxx11::string::~string((string *)&flag);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_c0 + 0x10));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_38 + 0x10));
  return 0;
}

Assistant:

DLL_EXPORT int test_strutil_compmatch(ITesting *t) {
    std::vector<std::string> patterns = {"!func", "flurp"};
    std::vector<std::string> cases = {"func", "flurp", "apa"};
    std::string tc = "flurp";

    int flag = 1;
    for(auto p : patterns) {
        auto isMatch = trun::match(tc, p);
        flag &= isMatch?1:0;
    }
    printf("flag: %d\n", flag);
    return kTR_Pass;
}